

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

wasm_importtype_t *
wasm_importtype_new(wasm_name_t *module,wasm_name_t *name,wasm_externtype_t *type)

{
  wasm_importtype_t *this;
  pointer pEVar1;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_b0;
  string local_a8;
  string local_88;
  ImportType local_68;
  wasm_externtype_t *local_20;
  wasm_externtype_t *type_local;
  wasm_name_t *name_local;
  wasm_name_t *module_local;
  
  local_20 = type;
  type_local = (wasm_externtype_t *)name;
  name_local = module;
  this = (wasm_importtype_t *)operator_new(0x70);
  ToString_abi_cxx11_(&local_88,name_local);
  ToString_abi_cxx11_(&local_a8,(wasm_message_t *)type_local);
  pEVar1 = std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
           ::operator->(&local_20->I);
  (*pEVar1->_vptr_ExternType[2])(&local_b0);
  wabt::interp::ImportType::ImportType(&local_68,&local_88,&local_a8,&local_b0);
  wasm_importtype_t::wasm_importtype_t(this,&local_68);
  wabt::interp::ImportType::~ImportType(&local_68);
  std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
  ~unique_ptr(&local_b0);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  return this;
}

Assistant:

own wasm_importtype_t* wasm_importtype_new(own wasm_name_t* module,
                                           own wasm_name_t* name,
                                           own wasm_externtype_t* type) {
  return new wasm_importtype_t{
      ImportType{ToString(module), ToString(name), type->I->Clone()}};
}